

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::IfcFooting(IfcFooting *this)

{
  IfcFooting *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcFooting");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00fe5080);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>,
             &PTR_construction_vtable_24__00fe51b8);
  *(undefined8 *)this = 0xfe4f50;
  *(undefined8 *)&this->field_0x178 = 0xfe5068;
  *(undefined8 *)&this->field_0x88 = 0xfe4f78;
  *(undefined8 *)&this->field_0x98 = 0xfe4fa0;
  *(undefined8 *)&this->field_0xd0 = 0xfe4fc8;
  *(undefined8 *)&this->field_0x100 = 0xfe4ff0;
  *(undefined8 *)&this->field_0x138 = 0xfe5018;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xfe5040;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x10);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}